

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  long lVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Node *pNVar6;
  long in_FS_OFFSET;
  Node *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar6 = this->head_;
  uVar5 = (this->max_height_).super___atomic_base<int>._M_i - 1;
  do {
    if ((int)uVar5 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                    ,0x9a,
                    "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
    pNVar2 = pNVar6->next_[uVar5]._M_b._M_p;
    if (pNVar2 == (Node *)0x0) {
LAB_00676d83:
      if (prev != (Node **)0x0) {
        prev[uVar5] = pNVar6;
      }
      if (uVar5 == 0) {
        uVar5 = 0;
        bVar3 = false;
        local_48 = pNVar2;
      }
      else {
        uVar5 = uVar5 - 1;
        bVar3 = true;
      }
    }
    else {
      iVar4 = MemTable::KeyComparator::operator()(&this->compare_,pNVar2->key,*key);
      if (-1 < iVar4) goto LAB_00676d83;
      bVar3 = true;
      pNVar6 = pNVar2;
    }
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_48;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}